

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgallocator.c
# Opt level: O2

mg_linear_allocator *
mg_linear_allocator_init(mg_allocator *allocator,size_t block_size,size_t sep_alloc_threshold)

{
  mg_memory_block *pmVar1;
  mg_linear_allocator *pmVar2;
  
  pmVar1 = mg_memory_block_alloc(allocator,block_size);
  if (pmVar1 != (mg_memory_block *)0x0) {
    pmVar2 = (mg_linear_allocator *)(*allocator->malloc)(allocator,0x40);
    if (pmVar2 != (mg_linear_allocator *)0x0) {
      pmVar2->malloc = mg_linear_allocator_malloc;
      pmVar2->realloc = mg_linear_allocator_realloc;
      pmVar2->free = mg_linear_allocator_free;
      pmVar2->current_block = pmVar1;
      pmVar2->current_offset = 0;
      pmVar2->block_size = block_size;
      pmVar2->sep_alloc_threshold = sep_alloc_threshold;
      pmVar2->underlying_allocator = allocator;
      return pmVar2;
    }
    (*allocator->free)(allocator,pmVar1);
  }
  return (mg_linear_allocator *)0x0;
}

Assistant:

mg_linear_allocator *mg_linear_allocator_init(mg_allocator *allocator,
                                              size_t block_size,
                                              size_t sep_alloc_threshold) {
  mg_memory_block *first_block = mg_memory_block_alloc(allocator, block_size);
  if (!first_block) {
    return NULL;
  }

  mg_linear_allocator tmp_alloc = {mg_linear_allocator_malloc,
                                   mg_linear_allocator_realloc,
                                   mg_linear_allocator_free,
                                   first_block,
                                   0,
                                   block_size,
                                   sep_alloc_threshold,
                                   allocator};
  mg_linear_allocator *alloc =
      mg_allocator_malloc(allocator, sizeof(mg_linear_allocator));
  if (!alloc) {
    mg_allocator_free(allocator, first_block);
    return NULL;
  }

  memcpy(alloc, &tmp_alloc, sizeof(mg_linear_allocator));
  return alloc;
}